

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iuutil::CmpHelperNeIterator<int*,int*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,int *b2,int *e2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte bVar3;
  byte bVar4;
  AssertionResult *pAVar5;
  AssertionResult *pAVar6;
  bool bVar7;
  bool bVar8;
  Message ar;
  int *in_stack_fffffffffffffc78;
  AssertionResult local_380;
  AssertionResult *local_358;
  int *local_350;
  iuutil *local_348;
  AssertionResult local_340 [3];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [392];
  
  local_358 = __return_storage_ptr__;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  bVar7 = this != (iuutil *)b1;
  bVar8 = e1 != b2;
  local_348 = (iuutil *)b1;
  if (bVar7 && bVar8) {
    bVar4 = 0;
    local_350 = b2;
    do {
      if (*(int *)this == *e1) {
        iutest::internal::CmpHelperOpFailure<int,int>
                  (&local_380,(internal *)0x326f27,"","!=",(char *)this,e1,in_stack_fffffffffffffc78
                  );
      }
      else {
        local_380.m_message._M_dataplus._M_p = (pointer)&local_380.m_message.field_2;
        local_380.m_message._M_string_length = 0;
        local_380.m_message.field_2._M_local_buf[0] = '\0';
        local_380.m_result = true;
      }
      iutest::AssertionResult::operator!(local_340,&local_380);
      bVar8 = local_340[0].m_result;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340[0].m_message._M_dataplus._M_p != &local_340[0].m_message.field_2) {
        operator_delete(local_340[0].m_message._M_dataplus._M_p,
                        CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                                 local_340[0].m_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380.m_message._M_dataplus._M_p != &local_380.m_message.field_2) {
        operator_delete(local_380.m_message._M_dataplus._M_p,
                        CONCAT71(local_380.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_380.m_message.field_2._M_local_buf[0]) + 1);
      }
      bVar3 = 1;
      if (bVar8 != false) {
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        std::ostream::operator<<(&local_340[0].m_message.field_2,*(int *)this);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_2c0);
        iutest::detail::iuStreamMessage::operator<<
                  ((iuStreamMessage *)local_1b8,&local_380.m_message);
        bVar3 = bVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380.m_message._M_dataplus._M_p != &local_380.m_message.field_2) {
          operator_delete(local_380.m_message._M_dataplus._M_p,
                          CONCAT71(local_380.m_message.field_2._M_allocated_capacity._1_7_,
                                   local_380.m_message.field_2._M_local_buf[0]) + 1);
        }
      }
      this = this + 4;
      e1 = e1 + 1;
      bVar8 = e1 != local_350;
      bVar7 = this != local_348;
    } while ((bVar7) && (bVar4 = bVar3, e1 != local_350));
  }
  else {
    bVar3 = 0;
  }
  if ((bool)(bVar7 | bVar8 | bVar3)) {
    (local_358->m_message)._M_dataplus._M_p = (pointer)&(local_358->m_message).field_2;
    (local_358->m_message)._M_string_length = 0;
    (local_358->m_message).field_2._M_local_buf[0] = '\0';
    local_358->m_result = true;
    pAVar6 = local_358;
  }
  else {
    paVar1 = &local_340[0].m_message.field_2;
    local_340[0].m_message._M_string_length = 0;
    local_340[0].m_message.field_2._M_local_buf[0] = '\0';
    local_340[0].m_result = false;
    local_340[0].m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar5 = iutest::AssertionResult::operator<<(local_340,(iuStreamMessage *)local_1b8);
    pAVar6 = local_358;
    (local_358->m_message)._M_dataplus._M_p = (pointer)&(local_358->m_message).field_2;
    pcVar2 = (pAVar5->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_358,pcVar2,pcVar2 + (pAVar5->m_message)._M_string_length);
    pAVar6->m_result = pAVar5->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340[0].m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_340[0].m_message._M_dataplus._M_p,
                      CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                               local_340[0].m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return pAVar6;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = false;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::NeHelper<false>::Compare("", "", *b1, *b2))
        {
            ar << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2);
        }
        else
        {
            result = true;
        }
    }
    if( (b1 != e1) || (b2 != e2) )
    {
        result = true;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}